

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::Interpreter::ReParseMultiNetworkSyntax
          (Error *__return_storage_ptr__,Interpreter *this,Expression *aExpr,Expression *aRetExpr)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar5;
  char *pcVar6;
  pointer __x;
  bool bVar7;
  bool bVar8;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string prefix;
  string lastKey;
  writer write_1;
  writer write;
  StringArray *arrays [6];
  long local_158;
  string local_138;
  char *local_118;
  char *pcStack_110;
  char local_108 [16];
  format_string_checker<char> local_f8;
  pointer local_c0;
  undefined1 local_b8 [32];
  ErrorCode local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  writer local_70;
  Expression *local_68;
  Interpreter *local_60;
  StringArray *local_58;
  StringArray *local_50;
  StringArray *local_48;
  StringArray *local_40;
  
  local_58 = &(this->mContext).mDomAliases;
  local_50 = &(this->mContext).mExportFiles;
  local_48 = &(this->mContext).mImportFiles;
  local_40 = &(this->mContext).mCommandKeys;
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  bVar8 = false;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_118 = local_108;
  pcStack_110 = (char *)0x0;
  local_108[0] = '\0';
  __x = (aExpr->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  local_c0 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_68 = aRetExpr;
  local_60 = this;
  if (__x == local_c0) {
    iVar3 = 2;
  }
  else {
    local_158 = 0;
    bVar8 = false;
    do {
      std::__cxx11::string::substr((ulong)&local_138,(ulong)__x);
      iVar3 = std::__cxx11::string::compare((char *)&local_138);
      if (iVar3 == 0) {
        if (bVar8) {
          local_f8.types_[0] = string_type;
          pcVar5 = "keyword \'{}\' used with no parameter";
          local_f8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "keyword \'{}\' used with no parameter";
          local_f8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
          local_f8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
          local_f8.context_.super_basic_format_parse_context<char>._20_4_ = 1;
          local_f8.context_.types_ = local_f8.types_;
          local_f8.parse_funcs_[0] =
               ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_70.handler_ = (format_string_checker<char> *)local_f8.context_.types_;
          do {
            if (pcVar5 == "") break;
            pcVar6 = pcVar5;
            if (*pcVar5 == '{') {
LAB_001341f2:
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()(&local_70,pcVar5,pcVar6);
              pcVar5 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                 (pcVar6,"",&local_f8);
              bVar7 = true;
            }
            else {
              pcVar6 = pcVar5 + 1;
              bVar7 = pcVar6 != "";
              if (bVar7) {
                if (*pcVar6 != '{') {
                  pcVar2 = pcVar5 + 2;
                  do {
                    pcVar6 = pcVar2;
                    bVar7 = pcVar6 != "";
                    if (pcVar6 == "") goto LAB_001341ee;
                    pcVar2 = pcVar6 + 1;
                  } while (*pcVar6 != '{');
                }
                bVar7 = true;
              }
LAB_001341ee:
              if (bVar7) goto LAB_001341f2;
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()(&local_70,pcVar5,"");
              bVar7 = false;
            }
          } while (bVar7);
          local_f8._0_8_ = local_118;
          local_f8.context_.super_basic_format_parse_context<char>.format_str_.data_ = pcStack_110;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0x23;
          args.field_1.args_ = in_R9.args_;
          args.desc_ = (unsigned_long_long)&local_f8;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_b8,(v10 *)"keyword \'{}\' used with no parameter",fmt,args);
          local_98 = kInvalidArgs;
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,local_b8._0_8_,(pointer)(local_b8._0_8_ + local_b8._8_8_));
          __return_storage_ptr__->mCode = local_98;
          std::__cxx11::string::operator=((string *)this_00,(string *)local_90);
          if (local_90[0] != local_80) {
            operator_delete(local_90[0]);
          }
          if ((format_string_checker<char> *)local_b8._0_8_ !=
              (format_string_checker<char> *)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_);
          }
          iVar3 = 6;
          bVar7 = false;
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_118);
          iVar4 = std::__cxx11::string::compare((char *)__x);
          iVar3 = 0;
          if (iVar4 == 0) {
            local_158 = 1;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)__x);
            if (iVar4 == 0) {
              local_158 = 2;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)__x);
              if (iVar4 != 0) {
                iVar4 = std::__cxx11::string::compare((char *)__x);
                bVar7 = true;
                if (iVar4 != 0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(local_40,__x);
                  local_158 = 5;
                  goto LAB_00134150;
                }
                local_158 = 4;
                bVar8 = true;
                goto LAB_00134382;
              }
              local_158 = 3;
            }
          }
          bVar8 = true;
          bVar7 = true;
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((&local_68)[local_158],__x);
LAB_00134150:
        bVar8 = false;
        bVar7 = true;
        iVar3 = 0;
      }
LAB_00134382:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if (!bVar7) goto LAB_001343d2;
      __x = __x + 1;
    } while (__x != local_c0);
    iVar3 = 2;
  }
LAB_001343d2:
  if (iVar3 != 6) {
    if (iVar3 != 2) {
      if (local_118 != local_108) {
        operator_delete(local_118);
      }
      pcVar5 = (this_00->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 == paVar1) {
        return __return_storage_ptr__;
      }
      goto LAB_00134557;
    }
    if (bVar8) {
      local_f8.types_[0] = string_type;
      pcVar5 = "keyword \'{}\' used with no parameter";
      local_f8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "keyword \'{}\' used with no parameter";
      local_f8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
      local_f8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_f8.context_.super_basic_format_parse_context<char>._20_4_ = 1;
      local_f8.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_f8.context_.types_ = local_f8.types_;
      local_b8._0_8_ = &local_f8;
      do {
        if (pcVar5 == "") break;
        pcVar6 = pcVar5;
        if (*pcVar5 == '{') {
LAB_0013447d:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_b8,pcVar5,pcVar6);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar6,"",&local_f8);
          bVar8 = true;
        }
        else {
          pcVar6 = pcVar5 + 1;
          bVar8 = pcVar6 != "";
          if (bVar8) {
            if (*pcVar6 != '{') {
              pcVar2 = pcVar5 + 2;
              do {
                pcVar6 = pcVar2;
                bVar8 = pcVar6 != "";
                if (pcVar6 == "") goto LAB_00134479;
                pcVar2 = pcVar6 + 1;
              } while (*pcVar6 != '{');
            }
            bVar8 = true;
          }
LAB_00134479:
          if (bVar8) goto LAB_0013447d;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_b8,pcVar5,"");
          bVar8 = false;
        }
      } while (bVar8);
      local_f8._0_8_ = local_118;
      local_f8.context_.super_basic_format_parse_context<char>.format_str_.data_ = pcStack_110;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x23;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_f8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_138,(v10 *)"keyword \'{}\' used with no parameter",fmt_00,args_00);
      local_98 = kInvalidArgs;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_138._M_dataplus._M_p,
                 local_138._M_dataplus._M_p + local_138._M_string_length);
      __return_storage_ptr__->mCode = local_98;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_90);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
    }
  }
  pcVar5 = local_118;
  if (local_118 == local_108) {
    return __return_storage_ptr__;
  }
LAB_00134557:
  operator_delete(pcVar5);
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::ReParseMultiNetworkSyntax(const Expression &aExpr, Expression &aRetExpr)
{
    enum
    {
        ST_COMMAND,
        ST_NETWORK,
        ST_DOMAIN,
        ST_EXPORT,
        ST_IMPORT,
        ST_CMD_KEYS
    };
    StringArray *arrays[] = {[ST_COMMAND]  = &aRetExpr,
                             [ST_NETWORK]  = &mContext.mNwkAliases,
                             [ST_DOMAIN]   = &mContext.mDomAliases,
                             [ST_EXPORT]   = &mContext.mExportFiles,
                             [ST_IMPORT]   = &mContext.mImportFiles,
                             [ST_CMD_KEYS] = &mContext.mCommandKeys};
    Error        error;

    uint8_t     state = ST_COMMAND;
    bool        inKey = false;
    std::string lastKey;

    for (const auto &word : aExpr)
    {
        std::string prefix = word.substr(0, 2);

        /*
         * Note: the syntax allows multiple specification of the same key
         *
         * Example: the cases below are parsed equivalently
         *  --nwk nid1 nid2 nid3 --export path
         *  --nwk nid1 --nwk nid2 nid3 --export path
         *  --nwk nid1 --export path --nwk nid2 --nwk nid3
         */

        if (prefix == "--")
        {
            VerifyOrExit(!inKey, error = ERROR_INVALID_ARGS(SYNTAX_NO_PARAM, lastKey));
            lastKey = word;
            inKey   = true;
            if (word == KEYWORD_NETWORK)
                state = ST_NETWORK;
            else if (word == KEYWORD_DOMAIN)
                state = ST_DOMAIN;
            else if (word == KEYWORD_EXPORT)
                state = ST_EXPORT;
            else if (word == KEYWORD_IMPORT)
                state = ST_IMPORT;
            else
            {
                // Some commands have command line parameters that are to be passed without any change including the
                // key.
                inKey = false;
                state = ST_CMD_KEYS;
                arrays[state]->push_back(word);
            }
        }
        else
        {
            inKey = false;
            // Note: avoid accidental conversion of the PSKd to lower case (see TS 8.2, Joining Device Credential
            // in the table 8.2
            arrays[state]->push_back(word);
        }
    }
    if (inKey) // test if we exit for() with trailing keyword
    {
        error = ERROR_INVALID_ARGS(SYNTAX_NO_PARAM, lastKey);
    }
exit:
    return error;
}